

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

int32_t icu_63::ICU_Utility::parsePattern
                  (UnicodeString *pat,Replaceable *text,int32_t index,int32_t limit)

{
  short sVar1;
  UBool UVar2;
  uint uVar3;
  uint c;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  uVar7 = (ulong)(uint)index;
  sVar1 = (pat->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar8 = (pat->fUnion).fFields.fLength;
  }
  else {
    iVar8 = (int)sVar1 >> 5;
  }
  if (iVar8 == 0) {
    return index;
  }
  iVar8 = 0;
LAB_0018da12:
  do {
    uVar3 = UnicodeString::char32At(pat,iVar8);
    while( true ) {
      iVar6 = (int)uVar7;
      if (limit <= iVar6) {
        return -1;
      }
      c = (*(text->super_UObject)._vptr_UObject[10])(text,uVar7);
      if (uVar3 != 0x7e) {
        if (c != uVar3) {
          return -1;
        }
        iVar4 = 2 - (uint)(uVar3 < 0x10000);
        sVar1 = (pat->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar5 = (pat->fUnion).fFields.fLength;
        }
        else {
          iVar5 = (int)sVar1 >> 5;
        }
        uVar3 = iVar6 + iVar4;
        uVar7 = (ulong)uVar3;
        iVar8 = iVar8 + iVar4;
        if (iVar8 == iVar5) {
          return uVar3;
        }
        goto LAB_0018da12;
      }
      UVar2 = PatternProps::isWhiteSpace(c);
      if (UVar2 == '\0') break;
      uVar7 = (ulong)((iVar6 - (uint)(c < 0x10000)) + 2);
      uVar3 = 0x7e;
    }
    sVar1 = (pat->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (pat->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    iVar8 = iVar8 + 1;
    if (iVar8 == iVar4) {
      return iVar6;
    }
  } while( true );
}

Assistant:

int32_t ICU_Utility::parsePattern(const UnicodeString& pat,
                                  const Replaceable& text,
                                  int32_t index,
                                  int32_t limit) {
    int32_t ipat = 0;

    // empty pattern matches immediately
    if (ipat == pat.length()) {
        return index;
    }

    UChar32 cpat = pat.char32At(ipat);

    while (index < limit) {
        UChar32 c = text.char32At(index);

        // parse \s*
        if (cpat == 126 /*~*/) {
            if (PatternProps::isWhiteSpace(c)) {
                index += U16_LENGTH(c);
                continue;
            } else {
                if (++ipat == pat.length()) {
                    return index; // success; c unparsed
                }
                // fall thru; process c again with next cpat
            }
        }

        // parse literal
        else if (c == cpat) {
            index += U16_LENGTH(c);
            ipat += U16_LENGTH(cpat);
            if (ipat == pat.length()) {
                return index; // success; c parsed
            }
            // fall thru; get next cpat
        }

        // match failure of literal
        else {
            return -1;
        }

        cpat = pat.char32At(ipat);
    }

    return -1; // text ended before end of pat
}